

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  _Prime_rehash_policy *filename;
  allocator<char> *__a;
  size_t sVar1;
  _Base_ptr p_Var2;
  pointer ppcVar3;
  pointer ppMVar4;
  MUFile *text;
  cmGeneratorTarget *this_00;
  pointer pQVar5;
  pointer pcVar6;
  key_type *pkVar7;
  pointer pbVar8;
  size_type sVar9;
  bool bVar10;
  byte bVar11;
  FileFormat FVar12;
  int iVar13;
  string *psVar14;
  string *psVar15;
  char *pcVar16;
  iterator iVar17;
  mapped_type *this_01;
  string *in_RCX;
  ulong uVar18;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar19;
  byte bVar20;
  cmMakefile *extraout_RDX;
  cmMakefile *extraout_RDX_00;
  cmMakefile *extraout_RDX_01;
  cmMakefile *pcVar21;
  cmMakefile *extraout_RDX_02;
  cmMakefile *extraout_RDX_03;
  cmMakefile *extraout_RDX_04;
  cmMakefile *extraout_RDX_05;
  cmMakefile *extraout_RDX_06;
  cmMakefile *extraout_RDX_07;
  cmMakefile *extraout_RDX_08;
  cmMakefile *extraout_RDX_09;
  _Base_ptr p_Var22;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf;
  cmSourceFile *pcVar23;
  long lVar24;
  pointer pQVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  long lVar26;
  key_type *__rhs;
  pointer pQVar27;
  undefined1 rcc;
  undefined8 in_R8;
  Qrc *qrc_1;
  _Alloc_hider _Var28;
  pointer ppMVar29;
  pointer pQVar30;
  iterator __begin3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  pointer ppcVar32;
  pair<std::__detail::_Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>,_bool>
  pVar33;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar34;
  string pathError;
  string opts;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  cmSourceFile *sf;
  string SKIP_AUTOGEN_str;
  Qrc qrc;
  string AUTORCC_OPTIONS_str;
  string SKIP_AUTORCC_str;
  string ui_str;
  string qrc_str;
  string SKIP_AUTOMOC_str;
  anon_class_32_4_0bc3998a makeMUFile;
  string AUTOUIC_OPTIONS_str;
  string SKIP_AUTOUIC_str;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [40];
  _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_320;
  cmMakefile *local_318;
  cmMakefile *local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  undefined1 local_2e8 [16];
  string local_2d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2b8;
  cmSourceFile *local_2b0;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  __node_base local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  __buckets_ptr local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c0 [24];
  _Alloc_hider local_1a8;
  _Base_ptr local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  pointer pbStack_158;
  pointer local_150;
  pointer pbStack_148;
  string local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8 [2];
  pointer local_b8 [2];
  undefined1 local_a8 [32];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_38;
  
  local_318 = this->Target->Target->Makefile;
  local_2a8._0_8_ = local_2a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"SKIP_AUTOGEN","");
  local_b8[0] = (pointer)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"SKIP_AUTOMOC","");
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SKIP_AUTOUIC","");
  local_118._M_allocated_capacity = (size_type)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SKIP_AUTORCC","");
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"AUTOUIC_OPTIONS","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AUTORCC_OPTIONS","");
  local_d8._M_allocated_capacity = (size_type)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"qrc","");
  local_f8._M_allocated_capacity = (size_type)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ui","");
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_a8._16_8_ = (string *)local_2a8;
  local_a8._24_8_ = this;
  local_88._M_p = (pointer)local_b8;
  local_80 = &local_58;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (this->Target,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)(local_2e8 + 0x10));
  sVar9 = local_2d8._M_string_length;
  if (local_2d8._M_dataplus._M_p != (pointer)local_2d8._M_string_length) {
    local_2e8._8_8_ = &(this->AutogenTarget).FilesGenerated;
    local_320 = &(this->AutogenTarget).Sources._M_h;
    in_RCX = (string *)&(this->AutogenTarget).Headers;
    local_2b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &(this->Rcc).Qrcs;
    _Var28._M_p = local_2d8._M_dataplus._M_p;
    local_310 = (cmMakefile *)in_RCX;
    do {
      pcVar23 = *(cmSourceFile **)_Var28._M_p;
      local_368._8_8_ = (cmQtAutoGenInitializer *)0x0;
      local_358._0_8_ = local_358._0_8_ & 0xffffffffffffff00;
      local_368._0_8_ = (cmMakefile *)local_358;
      psVar14 = cmSourceFile::GetFullPath(pcVar23,(string *)local_368);
      if (((cmQtAutoGenInitializer *)local_368._8_8_ == (cmQtAutoGenInitializer *)0x0) &&
         (psVar14->_M_string_length != 0)) {
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar23);
        if (((this->Moc).super_GenVarsT.Enabled != false) ||
           (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
          FVar12 = cmSystemTools::GetFileFormat(psVar15);
          if (FVar12 == CXX_FILE_FORMAT) {
            in_R8 = 1;
            in_RCX = psVar14;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)(local_358 + 0x10),
                       (cmSourceFile *)(local_a8 + 0x10),(string *)pcVar23,SUB81(psVar14,0));
            if (((*(bool *)(local_348._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_348._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_348._0_8_ + 0x28) == true)) {
              local_288._0_8_ = local_348._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2e8._8_8_,(MUFile **)local_288);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_320,(cmSourceFile **)(local_348._0_8_ + 0x20),local_358 + 0x10);
          }
          else {
            if (FVar12 != HEADER_FILE_FORMAT) goto LAB_0031eec8;
            in_R8 = 1;
            in_RCX = psVar14;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)(local_358 + 0x10),
                       (cmSourceFile *)(local_a8 + 0x10),(string *)pcVar23,SUB81(psVar14,0));
            if (((*(bool *)(local_348._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_348._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_348._0_8_ + 0x28) == true)) {
              local_288._0_8_ = local_348._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_2e8._8_8_,(MUFile **)local_288);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_310,(cmSourceFile **)(local_348._0_8_ + 0x20),local_358 + 0x10);
          }
          if ((MUFile *)local_348._0_8_ != (MUFile *)0x0) {
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)(local_358 + 0x10),
                       (MUFile *)local_348._0_8_);
          }
        }
LAB_0031eec8:
        if ((((this->Rcc).super_GenVarsT.Enabled == true) &&
            (sVar1 = psVar15->_M_string_length, sVar1 == local_d8._8_8_)) &&
           (((sVar1 == 0 ||
             (iVar13 = bcmp((psVar15->_M_dataplus)._M_p,(void *)local_d8._M_allocated_capacity,sVar1
                           ), iVar13 == 0)) &&
            ((bVar10 = cmSourceFile::GetPropertyAsBool(pcVar23,(string *)local_2a8), !bVar10 &&
             (bVar10 = cmSourceFile::GetPropertyAsBool(pcVar23,(string *)&local_118), !bVar10))))))
        {
          local_288._0_8_ = local_288 + 0x10;
          in_RCX = (string *)0x0;
          local_288._8_8_ = (_Base_ptr)0x0;
          local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
          local_268._M_allocated_capacity = (size_type)&local_258;
          local_268._8_8_ = (pointer)0x0;
          local_258._M_local_buf[0] = '\0';
          local_248._M_nxt = (_Hash_node_base *)&local_238;
          local_240 = 0;
          local_238._M_local_buf[0] = '\0';
          local_228._M_p = (pointer)&local_218;
          local_220 = (__buckets_ptr)0x0;
          local_218._M_local_buf[0] = '\0';
          local_208._M_p = (pointer)&local_1f8;
          local_200 = 0;
          local_1f8._M_local_buf[0] = '\0';
          local_1e8._M_p = (pointer)&local_1d8;
          local_1e0 = 0;
          local_1d8._M_local_buf[0] = '\0';
          local_1c0._0_4_ = _S_red;
          local_1c0._8_8_ = (_Base_ptr)0x0;
          local_1c0._16_8_ = local_1c0;
          local_1a0 = (_Base_ptr)0x0;
          local_198._M_allocated_capacity = (size_type)&local_188;
          local_198._8_8_ = 0;
          local_188._M_local_buf[0] = '\0';
          local_178._0_1_ = false;
          local_178._1_1_ = false;
          local_150 = (pointer)0x0;
          pbStack_148 = (pointer)0x0;
          local_170.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pbStack_158 = (pointer)0x0;
          local_170.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_170.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8._M_p = (pointer)local_1c0._16_8_;
          cmsys::SystemTools::GetRealPath((string *)(local_358 + 0x10),psVar14,(string *)0x0);
          std::__cxx11::string::operator=
                    ((string *)local_268._M_local_buf,(string *)(local_358 + 0x10));
          if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
            operator_delete((void *)local_348._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_348._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          psVar14 = (string *)(local_358 + 0x10);
          cmsys::SystemTools::GetFilenameWithoutLastExtension(psVar14,(string *)&local_268);
          std::__cxx11::string::operator=((string *)&local_248,(string *)psVar14);
          if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
            operator_delete((void *)local_348._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_348._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          local_178._0_1_ = pcVar23->IsGenerated;
          pcVar16 = cmSourceFile::GetSafeProperty(pcVar23,&local_138);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar14,pcVar16,(allocator<char> *)&local_308);
          if ((_Elt_pointer)local_348._8_8_ != (_Elt_pointer)0x0) {
            cmSystemTools::ExpandListArgument(psVar14,&local_170,false);
          }
          if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
            operator_delete((void *)local_348._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_348._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          emplace_back<cmQtAutoGenInitializer::Qrc>
                    ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      *)local_2b8,(Qrc *)local_288);
          Qrc::~Qrc((Qrc *)local_288);
        }
      }
      if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
      }
      _Var28._M_p = _Var28._M_p + 8;
    } while (_Var28._M_p != (pointer)sVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    local_2d8.field_2._M_allocated_capacity - (long)local_2d8._M_dataplus._M_p);
  }
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  bVar10 = (this->Moc).super_GenVarsT.Enabled;
  uVar18 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar10);
  bVar11 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar11 | bVar10) & 1) != 0) {
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_308,(this->AutogenTarget).Sources._M_h._M_element_count * 2);
    local_288._0_8_ = local_288 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
    paVar31 = &local_258;
    local_268._M_allocated_capacity = (size_type)paVar31;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"_p","");
    local_2e8._8_8_ = cmMakefile::GetCMakeInstance(local_318);
    pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (pvVar19 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      local_320 = &(this->AutogenTarget).Headers._M_h;
      psVar14 = (string *)(local_2e8 + 0x10);
      do {
        local_2b8 = pvVar19;
        pQVar27 = *(pointer *)(pvVar19 + 0x10);
        if ((*(char *)((long)&(pQVar27->QrcFile)._M_string_length + 3) != '\0') ||
           (*(char *)((long)&(pQVar27->QrcFile)._M_string_length + 4) == '\x01')) {
          cmQtAutoGen::SubDirPrefix((string *)local_368,&pQVar27->LockFile);
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)(local_358 + 0x10),&pQVar27->LockFile);
          std::__cxx11::string::_M_append(local_368,local_348._0_8_);
          if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
            operator_delete((void *)local_348._0_8_,
                            (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_348._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          pcVar21 = (cmMakefile *)0x0;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_358 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_368,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_288 + (long)pcVar21));
            local_310 = pcVar21;
            p_Var2 = (((anon_struct_424_12_03782e7a_for_AutogenTarget *)(local_2e8._8_8_ + 0x150))->
                     DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            for (p_Var22 = (((anon_struct_424_12_03782e7a_for_AutogenTarget *)
                            (local_2e8._8_8_ + 0x150))->DependTargets)._M_t._M_impl.
                           super__Rb_tree_header._M_header._M_left; p_Var22 != p_Var2;
                p_Var22 = p_Var22 + 1) {
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)psVar14,local_348._0_8_,
                         (undefined1 *)
                         ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_348._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                         (long)&(((string *)local_348._0_8_)->_M_dataplus)._M_p));
              std::__cxx11::string::push_back(SUB81(psVar14,0));
              std::__cxx11::string::_M_append((char *)psVar14,*(ulong *)p_Var22);
              local_2b0 = cmMakefile::GetSource(local_318,psVar14,Known);
              if (local_2b0 == (cmSourceFile *)0x0) {
                bVar10 = cmsys::SystemTools::FileExists(psVar14);
                if (bVar10) {
                  local_2b0 = cmMakefile::CreateSource(local_318,psVar14,false,Known);
                }
                if (local_2b0 != (cmSourceFile *)0x0) goto LAB_0031f407;
              }
              else {
                iVar17 = std::
                         _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(local_320,&local_2b0);
                if ((iVar17.
                     super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                     ._M_cur == (__node_type *)0x0) &&
                   ((local_2b0->IsGenerated != false ||
                    (bVar10 = cmsys::SystemTools::FileExists(psVar14),
                    bVar10 && local_2b0 != (cmSourceFile *)0x0)))) {
LAB_0031f407:
                  in_R8 = 1;
                  InitScanFiles::anon_class_32_4_0bc3998a::operator()
                            ((anon_class_32_4_0bc3998a *)local_2e8,(cmSourceFile *)(local_a8 + 0x10)
                             ,(string *)local_2b0,SUB81(psVar14,0));
                  if (*(char *)((long)&(pQVar27->QrcFile)._M_string_length + 3) == '\0') {
                    *(bool *)(local_2e8._0_8_ + 0x2b) = false;
                  }
                  if (*(char *)((long)&(pQVar27->QrcFile)._M_string_length + 4) == '\0') {
                    *(bool *)(local_2e8._0_8_ + 0x2c) = false;
                  }
                  std::
                  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                  ::
                  emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                              *)&local_308,
                             (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                              *)local_2e8);
                  if ((MUFile *)local_2e8._0_8_ != (MUFile *)0x0) {
                    std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                              ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_2e8,
                               (MUFile *)local_2e8._0_8_);
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
              }
            }
            if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
              operator_delete((void *)local_348._0_8_,
                              (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_348._16_8_)->_M_impl).
                                             super__Vector_impl_data._M_start + 1));
            }
            pcVar21 = (cmMakefile *)
                      &(local_310->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
          } while (pcVar21 != (cmMakefile *)0x40);
          if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
            operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
          }
        }
        pvVar19 = *(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)local_2b8;
      } while (pvVar19 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0);
    }
    pbVar8 = local_308.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar23 = (cmSourceFile *)
                local_308.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar21 = (pcVar23->Location).Makefile;
        if (((*(undefined1 *)
               ((long)&(pcVar21->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start + 0x1b) != '\0') ||
            (*(undefined1 *)
              ((long)&(pcVar21->FindPackageRootPathStack).
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start + 0x1c) == '\x01')) &&
           (*(char *)((long)&(pcVar21->FindPackageRootPathStack).
                             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start + 0x18) == '\x01')) {
          local_368._0_8_ = pcVar21;
          std::
          vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>::
          emplace_back<cmQtAutoGenInitializer::MUFile*>
                    ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                      *)&(this->AutogenTarget).FilesGenerated,(MUFile **)local_368);
          pcVar21 = (pcVar23->Location).Makefile;
        }
        std::
        _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                  ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(this->AutogenTarget).Headers,
                   (_Elt_pointer *)
                   ((long)&(pcVar21->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start + 0x10),pcVar23);
        pcVar23 = (cmSourceFile *)&(pcVar23->Location).AmbiguousDirectory;
      } while (pcVar23 != (cmSourceFile *)pbVar8);
    }
    lVar24 = -0x40;
    do {
      if (paVar31 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar31->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar31->_M_allocated_capacity)[-2],paVar31->_M_allocated_capacity + 1)
        ;
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar31->_M_allocated_capacity + -4);
      lVar24 = lVar24 + 0x20;
    } while (lVar24 != 0);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_308);
    uVar18 = CONCAT71((int7)((ulong)pvVar19 >> 8),(this->Moc).super_GenVarsT.Enabled);
    bVar11 = (this->Uic).super_GenVarsT.Enabled;
  }
  bVar20 = (byte)(uVar18 & 0xffffffff) | bVar11;
  pcVar21 = (cmMakefile *)CONCAT71((int7)((uVar18 & 0xffffffff) >> 8),bVar20);
  if ((bVar20 & 1) != 0) {
    ppcVar32 = (local_318->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar3 = (local_318->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pcVar21 = local_318;
    if (ppcVar32 != ppcVar3) {
      local_320 = &(this->AutogenTarget).Sources._M_h;
      local_310 = (cmMakefile *)&(this->AutogenTarget).Headers;
      local_2b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &(this->Uic).FileFiles;
      local_38 = (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)&(this->Uic).FileOptions;
      local_2e8._8_8_ = &(this->Uic).SkipUi;
      __a = (allocator<char> *)(local_2e8 + 0x10);
      do {
        local_308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar32;
        local_288._8_8_ = (_Base_ptr)0x0;
        local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
        local_288._0_8_ = (MUFile *)(local_288 + 0x10);
        psVar14 = cmSourceFile::GetFullPath
                            ((cmSourceFile *)
                             local_308.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(string *)local_288);
        pcVar21 = extraout_RDX;
        if (((_Base_ptr)local_288._8_8_ == (_Base_ptr)0x0) && (psVar14->_M_string_length != 0)) {
          psVar15 = cmSourceFile::GetExtension_abi_cxx11_
                              ((cmSourceFile *)
                               local_308.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          FVar12 = cmSystemTools::GetFileFormat(psVar15);
          if (FVar12 == CXX_FILE_FORMAT) {
            iVar17 = std::
                     _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_320,(key_type *)&local_308);
            pcVar21 = extraout_RDX_02;
            if (iVar17.
                super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              in_R8 = 0;
              InitScanFiles::anon_class_32_4_0bc3998a::operator()
                        ((anon_class_32_4_0bc3998a *)local_368,(cmSourceFile *)(local_a8 + 0x10),
                         local_308.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar14,0));
              if ((*(bool *)(local_368._0_8_ + 0x29) != false) ||
                 (*(bool *)(local_368._0_8_ + 0x2a) == true)) {
                pVar33 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_320,&local_308,local_368);
                pcVar21 = pVar33._8_8_;
LAB_0031f74f:
                if ((cmMakefile *)local_368._0_8_ == (cmMakefile *)0x0) goto LAB_0031f815;
              }
LAB_0031f75d:
              std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                        ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_368,
                         (MUFile *)local_368._0_8_);
              pcVar21 = extraout_RDX_03;
            }
          }
          else if (FVar12 == HEADER_FILE_FORMAT) {
            iVar17 = std::
                     _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_310,(key_type *)&local_308);
            pcVar21 = extraout_RDX_01;
            if (iVar17.
                super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              in_R8 = 0;
              InitScanFiles::anon_class_32_4_0bc3998a::operator()
                        ((anon_class_32_4_0bc3998a *)local_368,(cmSourceFile *)(local_a8 + 0x10),
                         local_308.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar14,0));
              if ((*(bool *)(local_368._0_8_ + 0x29) != false) ||
                 (*(bool *)(local_368._0_8_ + 0x2a) == true)) {
                pVar33 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_310,&local_308,local_368);
                pcVar21 = pVar33._8_8_;
                goto LAB_0031f74f;
              }
              goto LAB_0031f75d;
            }
          }
          else {
            pcVar21 = extraout_RDX_00;
            if ((((this->Uic).super_GenVarsT.Enabled == true) &&
                (pcVar21 = (cmMakefile *)psVar15->_M_string_length,
                pcVar21 == (cmMakefile *)local_f8._8_8_)) &&
               ((pcVar21 == (cmMakefile *)0x0 ||
                (iVar13 = bcmp((psVar15->_M_dataplus)._M_p,(void *)local_f8._M_allocated_capacity,
                               (size_t)pcVar21), pcVar21 = extraout_RDX_04, iVar13 == 0)))) {
              cmsys::SystemTools::GetRealPath((string *)local_368,psVar14,(string *)0x0);
              bVar10 = cmSourceFile::GetPropertyAsBool
                                 ((cmSourceFile *)
                                  local_308.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(string *)local_2a8);
              if ((bVar10) ||
                 (bVar10 = cmSourceFile::GetPropertyAsBool
                                     ((cmSourceFile *)
                                      local_308.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(string *)&local_58)
                 , bVar10)) {
                pVar34 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)local_2e8._8_8_,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_368);
                pcVar21 = pVar34._8_8_;
              }
              else {
                pcVar16 = cmSourceFile::GetSafeProperty
                                    ((cmSourceFile *)
                                     local_308.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(string *)&local_78);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(local_358 + 0x10),pcVar16,__a);
                pcVar21 = extraout_RDX_07;
                if ((_Elt_pointer)local_348._8_8_ != (_Elt_pointer)0x0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            (local_2b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_368);
                  local_2d8._M_dataplus._M_p = (pointer)0x0;
                  local_2d8._M_string_length = 0;
                  local_2d8.field_2._M_allocated_capacity = 0;
                  cmSystemTools::ExpandListArgument
                            ((string *)(local_358 + 0x10),
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__a,false);
                  std::
                  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ::
                  emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (local_38,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)__a);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__a);
                  pcVar21 = extraout_RDX_08;
                }
                if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
                  operator_delete((void *)local_348._0_8_,
                                  (ulong)((long)&(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_348._16_8_)->_M_impl).
                                                 super__Vector_impl_data._M_start + 1));
                  pcVar21 = extraout_RDX_09;
                }
              }
              if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
                operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
                pcVar21 = extraout_RDX_05;
              }
            }
          }
        }
LAB_0031f815:
        if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
          pcVar21 = extraout_RDX_06;
        }
        ppcVar32 = ppcVar32 + 1;
      } while (ppcVar32 != ppcVar3);
      uVar18 = (ulong)(this->Moc).super_GenVarsT.Enabled;
      bVar11 = (this->Uic).super_GenVarsT.Enabled;
    }
  }
  if (((uVar18 & 1) == 0) && ((bVar11 & 1) == 0)) goto LAB_0031fbe8;
  ppMVar29 = (this->AutogenTarget).FilesGenerated.
             super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar4 = (this->AutogenTarget).FilesGenerated.
            super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar29 == ppMVar4) goto LAB_0031fbe8;
  if (this->CMP0071Accept == true) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&(this->AutogenTarget).DependFiles,&(*ppMVar29)->RealPath);
      ppMVar29 = ppMVar29 + 1;
    } while (ppMVar29 != ppMVar4);
    goto LAB_0031fbe8;
  }
  if (this->CMP0071Warn != true) goto LAB_0031fbe8;
  local_288._0_8_ = local_288 + 0x10;
  local_288._8_8_ = (_Base_ptr)0x0;
  local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
  cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_368,(cmPolicies *)0x47,(PolicyID)pcVar21);
  std::__cxx11::string::_M_append(local_288,local_368._0_8_);
  if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
  }
  std::__cxx11::string::push_back((char)local_288);
  local_368._8_8_ = (cmQtAutoGenInitializer *)0x0;
  local_358._0_8_ = local_358._0_8_ & 0xffffffffffffff00;
  bVar10 = (this->Uic).super_GenVarsT.Enabled;
  local_368._0_8_ = (cmMakefile *)local_358;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    pcVar16 = "SKIP_AUTOGEN";
    if (bVar10 == false) {
      in_R8 = 0xc;
      std::__cxx11::string::_M_replace((ulong)local_368,0,(char *)0x0,0x4a30b4);
    }
    else {
LAB_0031fa1c:
      std::__cxx11::string::operator=((string *)local_368,pcVar16);
    }
  }
  else {
    pcVar16 = "SKIP_AUTOUIC";
    if (bVar10 != false) goto LAB_0031fa1c;
  }
  std::__cxx11::string::append(local_288);
  rcc = (undefined1)in_R8;
  ppMVar29 = (this->AutogenTarget).FilesGenerated.
             super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar4 = (this->AutogenTarget).FilesGenerated.
            super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar29 != ppMVar4) {
    do {
      text = *ppMVar29;
      std::__cxx11::string::append(local_288);
      cmQtAutoGen::Quoted((string *)(local_358 + 0x10),&text->RealPath);
      std::__cxx11::string::_M_append(local_288,local_348._0_8_);
      if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
        operator_delete((void *)local_348._0_8_,
                        (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_348._16_8_)->_M_impl).super__Vector_impl_data.
                                       _M_start + 1));
      }
      std::__cxx11::string::push_back((char)local_288);
      rcc = (undefined1)in_R8;
      ppMVar29 = ppMVar29 + 1;
    } while (ppMVar29 != ppMVar4);
  }
  std::__cxx11::string::append(local_288);
  cmQtAutoGen::Tools_abi_cxx11_
            ((string *)(local_358 + 0x10),(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
             (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
  std::__cxx11::string::_M_append(local_288,local_348._0_8_);
  if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_348._16_8_)->_M_impl).super__Vector_impl_data._M_start
                           + 1));
  }
  std::__cxx11::string::append(local_288);
  std::__cxx11::string::_M_append(local_288,local_368._0_8_);
  std::__cxx11::string::append(local_288);
  std::__cxx11::string::_M_append(local_288,local_368._0_8_);
  std::__cxx11::string::append(local_288);
  cmMakefile::IssueMessage(local_318,AUTHOR_WARNING,(string *)local_288);
  if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
  }
  if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
LAB_0031fbe8:
  bVar10 = true;
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_320 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)CONCAT44(local_320._4_4_,(this->QtVersion).Major);
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this->Target;
    local_368._0_8_ = local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"AUTORCC_OPTIONS","");
    pcVar16 = cmGeneratorTarget::GetSafeProperty(this_00,(string *)local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,pcVar16,(allocator<char> *)(local_358 + 0x10));
    cmSystemTools::ExpandListArgument((string *)local_288,&local_308,false);
    if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
    }
    if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
      operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
    }
    pQVar27 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar27 != pQVar5) {
      lVar24 = 0;
      pQVar30 = pQVar27;
      do {
        pQVar30->Unique = true;
        pQVar25 = pQVar27;
        lVar26 = lVar24;
        do {
          if (((lVar26 != 0) &&
              (sVar1 = (pQVar30->QrcName)._M_string_length,
              sVar1 == (pQVar25->QrcName)._M_string_length)) &&
             ((sVar1 == 0 ||
              (iVar13 = bcmp((pQVar30->QrcName)._M_dataplus._M_p,(pQVar25->QrcName)._M_dataplus._M_p
                             ,sVar1), iVar13 == 0)))) {
            pQVar30->Unique = false;
            break;
          }
          pQVar25 = pQVar25 + 1;
          lVar26 = lVar26 + -0x148;
        } while (pQVar25 != pQVar5);
        pQVar30 = pQVar30 + 1;
        lVar24 = lVar24 + 0x148;
      } while (pQVar30 != pQVar5);
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)local_288,local_318);
    pcVar21 = (cmMakefile *)
              (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_310 = (cmMakefile *)
                (this->Rcc).Qrcs.
                super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar21 != local_310) {
      do {
        cmFilePathChecksum::getPart
                  ((string *)local_368,(cmFilePathChecksum *)local_288,
                   (string *)
                   &(pcVar21->FindPackageRootPathStack).
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last,10);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar21->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent,(string *)local_368);
        if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
        }
        local_368._0_8_ = local_358;
        pcVar6 = (this->Dir).Build._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,pcVar6,pcVar6 + (this->Dir).Build._M_string_length);
        std::__cxx11::string::append((char *)local_368);
        std::__cxx11::string::_M_append
                  ((char *)local_368,
                   (ulong)(pcVar21->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header
                          ._M_parent);
        std::__cxx11::string::append((char *)local_368);
        std::__cxx11::string::_M_append
                  ((char *)local_368,
                   (ulong)(pcVar21->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        std::__cxx11::string::append((char *)local_368);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar21->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,(string *)local_368);
        if ((undefined1 *)local_368._0_8_ != local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
        }
        local_368._0_8_ = local_358;
        pcVar6 = (this->Dir).Info._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,pcVar6,pcVar6 + (this->Dir).Info._M_string_length);
        std::__cxx11::string::append((char *)local_368);
        std::__cxx11::string::_M_append
                  (local_368,
                   (ulong)(pcVar21->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        if (*(char *)((long)&(pcVar21->SourceFileSearchIndex)._M_h._M_before_begin._M_nxt + 1) ==
            '\0') {
          std::__cxx11::string::_M_append
                    (local_368,
                     (ulong)(pcVar21->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_parent);
        }
        std::__cxx11::string::_M_assign((string *)pcVar21);
        std::__cxx11::string::append((char *)pcVar21);
        std::__cxx11::string::_M_assign((string *)&pcVar21->Targets);
        std::__cxx11::string::append((char *)&pcVar21->Targets);
        filename = &(pcVar21->Targets)._M_h._M_rehash_policy;
        std::__cxx11::string::_M_assign((string *)filename);
        std::__cxx11::string::append((char *)filename);
        local_318 = pcVar21;
        if (this->MultiConfig == true) {
          __rhs = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pkVar7 = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs != pkVar7) {
            do {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_2e8 + 0x10),"_",__rhs);
              cmQtAutoGen::AppendFilenameSuffix
                        ((string *)(local_358 + 0x10),(string *)filename,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_2e8 + 0x10));
              this_01 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&(pcVar21->AliasTargets)._M_t._M_impl.super__Rb_tree_header,
                                     __rhs);
              std::__cxx11::string::operator=((string *)this_01,(string *)(local_358 + 0x10));
              if ((MUFile *)local_348._0_8_ != (MUFile *)(local_358 + 0x20)) {
                operator_delete((void *)local_348._0_8_,
                                (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_348._16_8_)->_M_impl).
                                               super__Vector_impl_data._M_start + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
              }
              __rhs = __rhs + 1;
            } while (__rhs != pkVar7);
          }
        }
        if ((cmMakefile *)local_368._0_8_ != (cmMakefile *)local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_358._0_8_ + 1));
        }
        pcVar21 = (cmMakefile *)&(local_318->KnownFileSearchIndex)._M_h._M_before_begin;
      } while (pcVar21 != local_310);
    }
    lVar24 = -0x100;
    paVar31 = &local_198;
    do {
      if (paVar31 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar31->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar31->_M_allocated_capacity)[-2],paVar31->_M_allocated_capacity + 1)
        ;
      }
      if (&paVar31->_M_allocated_capacity + -4 != (size_type *)(&paVar31->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar31->_M_allocated_capacity)[-6],
                        (&paVar31->_M_allocated_capacity)[-4] + 1);
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar31->_M_allocated_capacity + -8);
      lVar24 = lVar24 + 0x40;
    } while (lVar24 != 0);
    pQVar27 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar5 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar27 != pQVar5) {
      pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (local_358 + 0x10);
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_368,&local_308);
        local_288._0_8_ = local_288 + 0x10;
        pcVar6 = (pQVar27->QrcName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_288,pcVar6,pcVar6 + (pQVar27->QrcName)._M_string_length);
        if ((_Base_ptr)local_288._8_8_ != (_Base_ptr)0x0) {
          p_Var22 = (_Base_ptr)0x0;
          do {
            if (*(char *)(local_288._0_8_ + (long)p_Var22) == '-') {
              *(char *)(local_288._0_8_ + (long)p_Var22) = '_';
            }
            p_Var22 = (_Base_ptr)((long)&((_Alloc_hider *)&p_Var22->_M_color)->_M_p + 1);
          } while ((_Base_ptr)local_288._8_8_ != p_Var22);
        }
        if (pQVar27->Unique == false) {
          std::__cxx11::string::append((char *)local_288);
          std::__cxx11::string::_M_append
                    ((char *)local_288,(ulong)(pQVar27->PathChecksum)._M_dataplus._M_p);
        }
        local_348._0_8_ = (MUFile *)0x0;
        local_348._8_8_ = (_Elt_pointer)0x0;
        local_348._16_8_ = (_Elt_pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>(pvVar19,(char (*) [6])0x4b2246);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (pvVar19,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_288);
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_368,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pvVar19,4 < (uint)local_320);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pvVar19);
        if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
        }
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_368,&pQVar27->Options,4 < (uint)local_320);
        local_288._16_8_ =
             (pQVar27->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pQVar27->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_358._0_8_;
        local_288._0_8_ =
             (pQVar27->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_288._8_8_ =
             (pQVar27->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pQVar27->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
        (pQVar27->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
        local_368._0_8_ = (cmMakefile *)0x0;
        local_368._8_8_ = (cmQtAutoGenInitializer *)0x0;
        local_358._0_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_368);
        pQVar27 = pQVar27 + 1;
      } while (pQVar27 != pQVar5);
      pQVar27 = (this->Rcc).Qrcs.
                super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pQVar5 = (this->Rcc).Qrcs.
               super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pQVar27 != pQVar5) {
        files = &pQVar27->Resources;
        do {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(files + -2))[1]._M_local_buf[0] == '\0') {
            local_288._0_8_ = local_288 + 0x10;
            local_288._8_8_ = (_Base_ptr)0x0;
            local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
            bVar10 = RccListInputs(this,(string *)
                                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                          *)(files + -0xc) + 1),files,(string *)local_288);
            if (!bVar10) {
              cmSystemTools::Error((string *)local_288);
              if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
                operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_308);
              bVar10 = false;
              goto LAB_003202bf;
            }
            if ((MUFile *)local_288._0_8_ != (MUFile *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
            }
          }
          pQVar27 = (pointer)(files + 1);
          files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&files[0xd].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        } while (pQVar27 != pQVar5);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_308);
    bVar10 = true;
  }
LAB_003202bf:
  if ((_Alloc_hider *)local_f8._M_allocated_capacity != local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8[0]._M_p + 1));
  }
  if ((pointer *)local_d8._M_allocated_capacity != local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,
                    (ulong)((long)&(local_c8[0]->Name)._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if ((_Alloc_hider *)local_118._M_allocated_capacity != local_108) {
    operator_delete((void *)local_118._M_allocated_capacity,(ulong)(local_108[0]._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  if (local_b8[0] != (pointer)local_a8) {
    operator_delete(local_b8[0],(ulong)(local_a8._0_8_ + 1));
  }
  if ((__node_base_ptr)local_2a8._0_8_ != (__node_base_ptr)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();

  // String constants
  std::string const SKIP_AUTOGEN_str = "SKIP_AUTOGEN";
  std::string const SKIP_AUTOMOC_str = "SKIP_AUTOMOC";
  std::string const SKIP_AUTOUIC_str = "SKIP_AUTOUIC";
  std::string const SKIP_AUTORCC_str = "SKIP_AUTORCC";
  std::string const AUTOUIC_OPTIONS_str = "AUTOUIC_OPTIONS";
  std::string const AUTORCC_OPTIONS_str = "AUTORCC_OPTIONS";
  std::string const qrc_str = "qrc";
  std::string const ui_str = "ui";

  auto makeMUFile = [&](cmSourceFile* sf, std::string const& fullPath,
                        bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOMOC_str));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == qrc_str) && !sf->GetPropertyAsBool(SKIP_AUTOGEN_str) &&
            !sf->GetPropertyAsBool(SKIP_AUTORCC_str)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(AUTORCC_OPTIONS_str);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& realPath = muf.RealPath;
        std::string basePath = cmQtAutoGen::SubDirPrefix(realPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(realPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == ui_str)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(AUTOUIC_OPTIONS_str);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty("AUTORCC_OPTIONS"), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        if (!RccListInputs(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}